

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O3

unsigned_long __thiscall tetgenmesh::randomnation(tetgenmesh *this,uint choices)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  
  if (choices < 0xae529) {
    uVar3 = (this->randomseed * 0x556 + 0x24d69) % 0xae529;
    this->randomseed = uVar3;
    uVar3 = uVar3 % (ulong)choices;
  }
  else {
    uVar2 = (this->randomseed * 0x556 + 0x24d69) % 0xae529;
    uVar1 = (int)uVar2 * 0x556 + 0x24d69;
    uVar3 = (ulong)(uVar1 + (uint)((ulong)uVar1 * 0x5dfc9957 >> 0x32) * -0xae529);
    this->randomseed = uVar3;
    uVar3 = (choices / 0xae529) * uVar2 + uVar3;
    uVar2 = 0;
    if (choices <= uVar3) {
      uVar2 = (ulong)choices;
    }
    uVar3 = uVar3 - uVar2;
  }
  return uVar3;
}

Assistant:

unsigned long tetgenmesh::randomnation(unsigned int choices)
{
  unsigned long newrandom;

  if (choices >= 714025l) {
    newrandom = (randomseed * 1366l + 150889l) % 714025l;
    randomseed = (newrandom * 1366l + 150889l) % 714025l;
    newrandom = newrandom * (choices / 714025l) + randomseed;
    if (newrandom >= choices) {
      return newrandom - choices;
    } else {
      return newrandom;
    }
  } else {
    randomseed = (randomseed * 1366l + 150889l) % 714025l;
    return randomseed % choices;
  }
}